

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::TimeRange::setTimeInterval(TimeRange *this,double init,double end)

{
  if (end < init) {
    iDynTree::reportError
              ("TimeRange","setTimeInterval","The init time should be grater than the end.");
  }
  else {
    this->m_initTime = init;
    this->m_endTime = end;
    this->m_anyTime = false;
  }
  return init <= end;
}

Assistant:

bool TimeRange::setTimeInterval(const double init, const double end)
        {
            if(init > end){
                reportError("TimeRange", "setTimeInterval", "The init time should be grater than the end.");
                return false;
            }

            m_initTime = init;
            m_endTime = end;
            m_anyTime = false;

            return true;
        }